

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void setJoinExpr(Expr *p,int iTable)

{
  ExprList *pEVar1;
  long lVar2;
  int i;
  long lVar3;
  
  for (; p != (Expr *)0x0; p = p->pRight) {
    *(byte *)&p->flags = (byte)p->flags | 1;
    p->iRightJoinTable = (i16)iTable;
    if ((p->op == 0x97) && (pEVar1 = (p->x).pList, pEVar1 != (ExprList *)0x0)) {
      lVar2 = 8;
      for (lVar3 = 0; lVar3 < pEVar1->nExpr; lVar3 = lVar3 + 1) {
        setJoinExpr(*(Expr **)((long)pEVar1->a + lVar2 + -8),iTable);
        pEVar1 = (p->x).pList;
        lVar2 = lVar2 + 0x20;
      }
    }
    setJoinExpr(p->pLeft,iTable);
  }
  return;
}

Assistant:

static void setJoinExpr(Expr *p, int iTable){
  while( p ){
    ExprSetProperty(p, EP_FromJoin);
    assert( !ExprHasProperty(p, EP_TokenOnly|EP_Reduced) );
    ExprSetVVAProperty(p, EP_NoReduce);
    p->iRightJoinTable = (i16)iTable;
    if( p->op==TK_FUNCTION && p->x.pList ){
      int i;
      for(i=0; i<p->x.pList->nExpr; i++){
        setJoinExpr(p->x.pList->a[i].pExpr, iTable);
      }
    }
    setJoinExpr(p->pLeft, iTable);
    p = p->pRight;
  } 
}